

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O3

Matrix44<float> * __thiscall
Imath_2_5::Matrix44<float>::setEulerAngles<float>(Matrix44<float> *this,Vec3<float> *r)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar1 = cosf(r->z);
  fVar2 = cosf(r->y);
  fVar3 = cosf(r->x);
  fVar4 = sinf(r->z);
  fVar5 = sinf(r->y);
  fVar6 = sinf(r->x);
  *(ulong *)this->x[0] = CONCAT44(fVar2 * fVar4,fVar2 * fVar1);
  this->x[0][2] = -fVar5;
  this->x[0][3] = 0.0;
  *(ulong *)this->x[1] =
       CONCAT44(fVar1 * fVar3 + fVar5 * fVar4 * fVar6,-fVar4 * fVar3 + fVar5 * fVar1 * fVar6);
  this->x[1][2] = fVar2 * fVar6;
  this->x[1][3] = 0.0;
  *(ulong *)this->x[2] =
       CONCAT44(-fVar1 * fVar6 + fVar3 * fVar5 * fVar4,fVar4 * fVar6 + fVar3 * fVar5 * fVar1);
  this->x[2][2] = fVar2 * fVar3;
  *(undefined8 *)(this->x[2] + 3) = 0;
  *(float *)((long)(this->x + 3) + 4) = 0.0;
  *(float *)((long)(this->x + 3) + 8) = 0.0;
  this->x[3][3] = 1.0;
  return this;
}

Assistant:

const Matrix44<T> &
Matrix44<T>::setEulerAngles (const Vec3<S>& r)
{
    S cos_rz, sin_rz, cos_ry, sin_ry, cos_rx, sin_rx;
    
    cos_rz = Math<T>::cos (r[2]);
    cos_ry = Math<T>::cos (r[1]);
    cos_rx = Math<T>::cos (r[0]);
    
    sin_rz = Math<T>::sin (r[2]);
    sin_ry = Math<T>::sin (r[1]);
    sin_rx = Math<T>::sin (r[0]);
    
    x[0][0] =  cos_rz * cos_ry;
    x[0][1] =  sin_rz * cos_ry;
    x[0][2] = -sin_ry;
    x[0][3] =  0;
    
    x[1][0] = -sin_rz * cos_rx + cos_rz * sin_ry * sin_rx;
    x[1][1] =  cos_rz * cos_rx + sin_rz * sin_ry * sin_rx;
    x[1][2] =  cos_ry * sin_rx;
    x[1][3] =  0;
    
    x[2][0] =  sin_rz * sin_rx + cos_rz * sin_ry * cos_rx;
    x[2][1] = -cos_rz * sin_rx + sin_rz * sin_ry * cos_rx;
    x[2][2] =  cos_ry * cos_rx;
    x[2][3] =  0;

    x[3][0] =  0;
    x[3][1] =  0;
    x[3][2] =  0;
    x[3][3] =  1;

    return *this;
}